

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  Fl_Plugin *pFVar7;
  undefined4 extraout_var;
  char *pcVar8;
  undefined4 extraout_var_00;
  int *piVar9;
  char *pcVar10;
  Fl_Int_Input *__stat_loc;
  char *c;
  Fl_Commandline_Plugin *pi_1;
  char *buf;
  Fl_Commandline_Plugin *pi;
  int local_3c;
  int n;
  int i_1;
  Fl_Plugin_Manager pm;
  int len;
  int i;
  char **argv_local;
  int argc_local;
  
  pm.super_Fl_Preferences.rootNode._4_4_ = 1;
  iVar2 = Fl::args(argc,argv,(int *)((long)&pm.super_Fl_Preferences.rootNode + 4),arg);
  if ((iVar2 == 0) || (pm.super_Fl_Preferences.rootNode._4_4_ < argc + -1)) {
    sVar4 = strlen(main::msg);
    sVar5 = strlen(*argv);
    sVar6 = strlen(
                  " -bg2 color\n -bg color\n -di[splay] host:n.n\n -dn[d]\n -fg color\n -g[eometry] WxH+X+Y\n -i[conic]\n -k[bd]\n -na[me] classname\n -nod[nd]\n -nok[bd]\n -not[ooltips]\n -s[cheme] scheme\n -ti[tle] windowtitle\n -to[oltips]"
                  );
    pm.super_Fl_Preferences.rootNode._0_4_ = (int)sVar4 + (int)sVar5 + (int)sVar6;
    Fl_Plugin_Manager::Fl_Plugin_Manager((Fl_Plugin_Manager *)&n,"commandline");
    iVar2 = Fl_Plugin_Manager::plugins((Fl_Plugin_Manager *)&n);
    for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
      pFVar7 = Fl_Plugin_Manager::plugin((Fl_Plugin_Manager *)&n,local_3c);
      if (pFVar7 != (Fl_Plugin *)0x0) {
        iVar3 = (*pFVar7->_vptr_Fl_Plugin[4])();
        sVar4 = strlen((char *)CONCAT44(extraout_var,iVar3));
        pm.super_Fl_Preferences.rootNode._0_4_ = (int)pm.super_Fl_Preferences.rootNode + (int)sVar4;
      }
    }
    pcVar8 = (char *)malloc((long)((int)pm.super_Fl_Preferences.rootNode + 1));
    sprintf(pcVar8,main::msg,*argv);
    for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
      pFVar7 = Fl_Plugin_Manager::plugin((Fl_Plugin_Manager *)&n,local_3c);
      if (pFVar7 != (Fl_Plugin *)0x0) {
        iVar3 = (*pFVar7->_vptr_Fl_Plugin[4])();
        strcat(pcVar8,(char *)CONCAT44(extraout_var_00,iVar3));
      }
    }
    strcat(pcVar8,
           " -bg2 color\n -bg color\n -di[splay] host:n.n\n -dn[d]\n -fg color\n -g[eometry] WxH+X+Y\n -i[conic]\n -k[bd]\n -na[me] classname\n -nod[nd]\n -nok[bd]\n -not[ooltips]\n -s[cheme] scheme\n -ti[tle] windowtitle\n -to[oltips]"
          );
    fprintf(_stderr,"%s\n",pcVar8);
    free(pcVar8);
    argv_local._4_4_ = 1;
    Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&n);
  }
  else {
    if (exit_early != 0) {
      exit(0);
    }
    pcVar8 = argv[pm.super_Fl_Preferences.rootNode._4_4_];
    fl_register_images();
    make_main_window();
    if (pcVar8 != (char *)0x0) {
      set_filename(pcVar8);
    }
    if (batch_mode == 0) {
      Fl::visual(3);
      Fl_File_Icon::load_system_icons();
      Fl_Widget::callback((Fl_Widget *)main_window,exit_cb);
      position_window(main_window,"main_window_pos",1,10,0x1e,300,0x20d);
      Fl_Window::show(main_window,argc,argv);
      toggle_widgetbin_cb((Fl_Widget *)0x0,(void *)0x0);
      toggle_sourceview_cb((Fl_Double_Window *)0x0,(void *)0x0);
      if (((pcVar8 == (char *)0x0) &&
          (cVar1 = Fl_Button::value((Fl_Button *)openlast_button), cVar1 != '\0')) &&
         (absolute_history[0][0] != '\0')) {
        open_history_cb((Fl_Widget *)0x0,absolute_history);
      }
    }
    undo_suspend();
    if ((pcVar8 != (char *)0x0) && (iVar2 = read_file(pcVar8,0), __stream = _stderr, iVar2 == 0)) {
      if (batch_mode != 0) {
        piVar9 = __errno_location();
        pcVar10 = strerror(*piVar9);
        fprintf(__stream,"%s : %s\n",pcVar8,pcVar10);
        exit(1);
      }
      piVar9 = __errno_location();
      pcVar10 = strerror(*piVar9);
      fl_message("Can\'t read %s: %s",pcVar8,pcVar10);
    }
    undo_resume();
    if ((update_file != 0) && (write_file(pcVar8,0), compile_file == 0)) {
      exit(0);
    }
    if (compile_file != 0) {
      if (compile_strings != 0) {
        write_strings_cb((Fl_Widget *)0x0,(void *)0x0);
      }
      write_cb((Fl_Widget *)0x0,(void *)0x0);
      exit(0);
    }
    set_modflag(0);
    undo_clear();
    signal(2,sigint);
    ExternalCodeEditor::set_update_timer_callback(external_editor_timer);
    __stat_loc = horizontal_input;
    grid_cb(horizontal_input,0);
    while (quit_flag == 0) {
      Fl::wait(__stat_loc);
    }
    if (quit_flag != 0) {
      exit_cb((Fl_Widget *)0x0,(void *)0x0);
    }
    undo_clear();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc,char **argv) {
  int i = 1;
  
  if (!Fl::args(argc,argv,i,arg) || i < argc-1) {
    static const char *msg = 
      "usage: %s <switches> name.fl\n"
      " -u : update .fl file and exit (may be combined with '-c' or '-cs')\n"
      " -c : write .cxx and .h and exit\n"
      " -cs : write .cxx and .h and strings and exit\n"
      " -o <name> : .cxx output filename, or extension if <name> starts with '.'\n"
      " -h <name> : .h output filename, or extension if <name> starts with '.'\n";
    int len = (int)(strlen(msg) + strlen(argv[0]) + strlen(Fl::help));
    Fl_Plugin_Manager pm("commandline");
    int i, n = pm.plugins();
    for (i=0; i<n; i++) {
      Fl_Commandline_Plugin *pi = (Fl_Commandline_Plugin*)pm.plugin(i);
      if (pi) len += strlen(pi->help());
    }
    char *buf = (char*)malloc(len+1);
    sprintf(buf, msg, argv[0]);
    for (i=0; i<n; i++) {
      Fl_Commandline_Plugin *pi = (Fl_Commandline_Plugin*)pm.plugin(i);
      if (pi) strcat(buf, pi->help());
    }
    strcat(buf, Fl::help);
#ifdef _MSC_VER
    fl_message("%s\n", buf);
#else
    fprintf(stderr, "%s\n", buf);
#endif
    free(buf);
    return 1;
  }
  if (exit_early)
    exit(0);
  
  const char *c = argv[i];

  fl_register_images();

  make_main_window();


  if (c) set_filename(c);
  if (!batch_mode) {
#ifdef __APPLE__
    fl_open_callback(apple_open_cb);
#endif // __APPLE__
    Fl::visual((Fl_Mode)(FL_DOUBLE|FL_INDEX));
    Fl_File_Icon::load_system_icons();
    main_window->callback(exit_cb);
    position_window(main_window,"main_window_pos", 1, 10, 30, WINWIDTH, WINHEIGHT );
    main_window->show(argc,argv);
    toggle_widgetbin_cb(0,0);
    toggle_sourceview_cb(0,0);
    if (!c && openlast_button->value() && absolute_history[0][0]) {
      // Open previous file when no file specified...
      open_history_cb(0, absolute_history[0]);
    }
  }
  undo_suspend();
  if (c && !read_file(c,0)) {
    if (batch_mode) {
      fprintf(stderr,"%s : %s\n", c, strerror(errno));
      exit(1);
    }
    fl_message("Can't read %s: %s", c, strerror(errno));
  }
  undo_resume();

  if (update_file) {		// fluid -u
    write_file(c,0);
    if (!compile_file)
      exit(0);
  }

  if (compile_file) {		// fluid -c[s]
    if (compile_strings)
      write_strings_cb(0,0);
    write_cb(0,0);
    exit(0);
  }
  set_modflag(0);
  undo_clear();
#ifndef WIN32
  signal(SIGINT,sigint);
#endif

  // Set (but do not start) timer callback for external editor updates
  ExternalCodeEditor::set_update_timer_callback(external_editor_timer);

  grid_cb(horizontal_input, 0); // Makes sure that windows get snap params...

#ifdef WIN32
  Fl::run();
#else
  while (!quit_flag) Fl::wait();

  if (quit_flag) exit_cb(0,0);
#endif // WIN32

  undo_clear();

  return (0);
}